

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error.cpp
# Opt level: O1

void verr(char *fmt,__va_list_tag *ap)

{
  int *piVar1;
  char *__s;
  
  fwrite("error: ",7,1,_stderr);
  vfprintf(_stderr,fmt,ap);
  fputs(": ",_stderr);
  piVar1 = __errno_location();
  __s = strerror(*piVar1);
  fputs(__s,_stderr);
  putc(10,_stderr);
  exit(1);
}

Assistant:

[[noreturn]] static void verr(char const NONNULL(fmt), va_list ap)
{
	fprintf(stderr, "error: ");
	vfprintf(stderr, fmt, ap);
	fputs(": ", stderr);
	fputs(strerror(errno), stderr);
	putc('\n', stderr);
	exit(1);
}